

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::
BinaryExpr<const_magic_enum::containers::array<Color,_unsigned_char,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>_&,_const_magic_enum::containers::array<Color,_unsigned_char,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>_&>
::streamReconstructedExpression
          (BinaryExpr<const_magic_enum::containers::array<Color,_unsigned_char,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>_&,_const_magic_enum::containers::array<Color,_unsigned_char,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>_&>
           *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  uchar *in_RCX;
  string *in_R9;
  StringRef op;
  string local_60;
  string local_40;
  
  Detail::rangeToString<unsigned_char_const*,unsigned_char_const*>
            (&local_40,(Detail *)this->m_lhs,(uchar *)((Detail *)this->m_lhs + 3),in_RCX);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  Detail::rangeToString<unsigned_char_const*,unsigned_char_const*>
            (&local_60,(Detail *)this->m_rhs,(uchar *)((Detail *)this->m_rhs + 3),in_RCX);
  op.m_size = (size_type)&local_60;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_40,lhs,op,in_R9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }